

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::GnuHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,GnuHash *this,char *name)

{
  byte bVar1;
  element_type *peVar2;
  uchar uVar3;
  uchar uVar4;
  Elf64_Section EVar5;
  Elf64_Addr EVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *name_1;
  byte *pbVar10;
  unsigned_long uVar11;
  uint uVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 auStack_58 [8];
  value_type sym;
  
  uVar13 = 0x1505;
  pbVar10 = (byte *)name;
  while( true ) {
    bVar1 = *pbVar10;
    uVar12 = (uint)uVar13;
    if (bVar1 == 0) break;
    pbVar10 = pbVar10 + 1;
    uVar13 = (ulong)(uVar12 * 0x21 + (uint)bVar1);
  }
  sym.st_size = (Elf64_Xword)name;
  uVar11 = Reader::readObj<unsigned_long>
                     ((this->hash).
                      super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)((int)((uVar13 >> 6) % (ulong)(this->header).bloom_size) * 8 + 0x10));
  bVar1 = (byte)(this->header).bloom_shift & 0x1f;
  if ((((1L << ((byte)(uVar12 >> bVar1) & 0x3f) | 1L << (uVar13 & 0x3f)) & ~uVar11) == 0) &&
     (uVar8 = Reader::readObj<unsigned_int>
                        ((this->hash).
                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         ,(ulong)((this->header).bloom_size * 8 +
                                  (int)(((ulong)(0 >> bVar1) << 0x20 | uVar13) %
                                       (ulong)(this->header).nbuckets) * 4 + 0x10)),
     (this->header).symoffset <= uVar8)) {
    while( true ) {
      Reader::readObj<Elf64_Sym>
                ((value_type *)auStack_58,
                 (this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)uVar8 * 0x18);
      uVar9 = Reader::readObj<unsigned_int>
                        ((this->hash).
                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         ,(ulong)((((this->header).nbuckets - (this->header).symoffset) + uVar8) * 4
                                  + (this->header).bloom_size * 8 + 0x10));
      if ((uVar9 ^ uVar12) < 2) {
        peVar2 = (this->strings).
                 super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar2->_vptr_Reader[7])(&local_78,peVar2,(ulong)(uint)auStack_58._0_4_);
        bVar7 = std::operator==(&local_78,(char *)sym.st_size);
        std::__cxx11::string::~string((string *)&local_78);
        if (bVar7) {
          __return_storage_ptr__->first = uVar8;
          (__return_storage_ptr__->second).st_name = auStack_58._0_4_;
          (__return_storage_ptr__->second).st_info = (char)auStack_58._4_4_;
          (__return_storage_ptr__->second).st_other = SUB41(auStack_58._4_4_,1);
          (__return_storage_ptr__->second).st_shndx = SUB42(auStack_58._4_4_,2);
          (__return_storage_ptr__->second).st_value = sym._0_8_;
          goto LAB_001733c5;
        }
      }
      if ((uVar9 & 1) != 0) break;
      uVar8 = uVar8 + 1;
    }
    undef();
    __return_storage_ptr__->first = 0;
    EVar6 = undef::theUndef.undefSym.st_value;
    uVar3 = undef::theUndef.undefSym.st_info;
    uVar4 = undef::theUndef.undefSym.st_other;
    EVar5 = undef::theUndef.undefSym.st_shndx;
    (__return_storage_ptr__->second).st_name = undef::theUndef.undefSym.st_name;
    (__return_storage_ptr__->second).st_info = uVar3;
    (__return_storage_ptr__->second).st_other = uVar4;
    (__return_storage_ptr__->second).st_shndx = EVar5;
    (__return_storage_ptr__->second).st_value = EVar6;
    sym.st_value = undef::theUndef.undefSym.st_size;
LAB_001733c5:
    (__return_storage_ptr__->second).st_size = sym.st_value;
  }
  else {
    undef();
    __return_storage_ptr__->first = 0;
    EVar6 = undef::theUndef.undefSym.st_value;
    uVar3 = undef::theUndef.undefSym.st_info;
    uVar4 = undef::theUndef.undefSym.st_other;
    EVar5 = undef::theUndef.undefSym.st_shndx;
    (__return_storage_ptr__->second).st_name = undef::theUndef.undefSym.st_name;
    (__return_storage_ptr__->second).st_info = uVar3;
    (__return_storage_ptr__->second).st_other = uVar4;
    (__return_storage_ptr__->second).st_shndx = EVar5;
    (__return_storage_ptr__->second).st_value = EVar6;
    (__return_storage_ptr__->second).st_size = undef::theUndef.undefSym.st_size;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<uint32_t, Sym>
GnuHash::findSymbol(const char *name) const {
    auto symhash = gnu_hash(name);

    auto bloomword = hash->readObj<Elf::Off>(bloomoff((symhash/ELF_BITS) % header.bloom_size));

    Elf::Off mask = Elf::Off(1) << symhash % ELF_BITS |
                    Elf::Off(1) << (symhash >> header.bloom_shift) % ELF_BITS;

    if ((bloomword & mask) != mask) {
       return std::make_pair(0, undef());
    }

    auto idx = hash->readObj<uint32_t>(bucketoff(symhash % header.nbuckets));
    if (idx < header.symoffset) {
        return std::make_pair(0, undef());
    }
    for (;;) {
        auto sym = syms->readObj<Sym>(idx * sizeof (Sym));
        auto chainhash = hash->readObj<uint32_t>(chainoff(idx - header.symoffset));
        if ((chainhash | 1U)  == (symhash | 1U) && strings->readString(sym.st_name) == name)
              return std::make_pair(idx, sym);
        if ((chainhash & 1U) != 0) {
           return std::make_pair(0, undef());
        }
        ++idx;
    }
}